

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void __thiscall AActor::RestoreSpecialPosition(AActor *this)

{
  double dVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  FLinkContext ctx;
  DVector2 local_28;
  
  dVar1 = (this->SpawnPoint).X;
  dVar5 = (this->SpawnPoint).Y;
  ctx.sector_list = (msecnode_t *)0x0;
  ctx.render_list = (msecnode_t *)0x0;
  local_28.X = dVar1;
  local_28.Y = dVar5;
  UnlinkFromWorld(this,&ctx);
  (this->__Pos).X = dVar1;
  (this->__Pos).Y = dVar5;
  LinkToWorld(this,&ctx,true,(sector_t *)0x0);
  dVar1 = secplane_t::ZatPoint(&this->Sector->floorplane,&local_28);
  (this->__Pos).Z = dVar1;
  P_FindFloorCeiling(this,0x11);
  if (((this->flags).Value & 0x100) == 0) {
    if (((this->flags2).Value & 0x40) == 0) {
      dVar1 = (this->SpawnPoint).Z + this->floorz;
    }
    else {
      dVar1 = this->floorz;
      dVar5 = (this->ceilingz - this->Height) - dVar1;
      if (48.0 < dVar5) {
        iVar2 = FRandom::operator()(&pr_restore);
        dVar1 = (double)iVar2 * (dVar5 + -40.0) * 0.00390625 + this->floorz + 40.0;
      }
    }
  }
  else {
    dVar1 = (this->ceilingz - this->Height) - (this->SpawnPoint).Z;
  }
  (this->__Pos).Z = dVar1;
  P_FindFloorCeiling(this,0xe);
  dVar1 = (this->__Pos).Z;
  uVar3 = SUB84(dVar1,0);
  uVar4 = (undefined4)((ulong)dVar1 >> 0x20);
  dVar5 = this->floorz;
  if (dVar1 < dVar5) {
    (this->__Pos).Z = dVar5;
    uVar3 = SUB84(dVar5,0);
    uVar4 = (undefined4)((ulong)dVar5 >> 0x20);
  }
  if (((this->flags).Value & 2) != 0) {
    if (this->ceilingz < (double)CONCAT44(uVar4,uVar3) + this->Height) {
      (this->__Pos).Z = this->ceilingz - this->Height;
    }
  }
  ClearInterpolation(this);
  return;
}

Assistant:

void AActor::RestoreSpecialPosition()
{
	// Move item back to its original location
	DVector2 sp = SpawnPoint;

	FLinkContext ctx;
	UnlinkFromWorld(&ctx);
	SetXY(sp);
	LinkToWorld(&ctx, true);
	SetZ(Sector->floorplane.ZatPoint(sp));
	P_FindFloorCeiling(this, FFCF_ONLYSPAWNPOS | FFCF_NOPORTALS);	// no portal checks here so that things get spawned in this sector.

	if (flags & MF_SPAWNCEILING)
	{
		SetZ(ceilingz - Height - SpawnPoint.Z);
	}
	else if (flags2 & MF2_SPAWNFLOAT)
	{
		double space = ceilingz - Height - floorz;
		if (space > 48)
		{
			space -= 40;
			SetZ((space * pr_restore()) / 256. + floorz + 40);
		}
		else
		{
			SetZ(floorz);
		}
	}
	else
	{
		SetZ(SpawnPoint.Z + floorz);
	}
	// Redo floor/ceiling check, in case of 3D floors and portals
	P_FindFloorCeiling(this, FFCF_SAMESECTOR | FFCF_ONLY3DFLOORS | FFCF_3DRESTRICT);
	if (Z() < floorz)
	{ // Do not reappear under the floor, even if that's where we were for the
	  // initial spawn.
		SetZ(floorz);
	}
	if ((flags & MF_SOLID) && (Top() > ceilingz))
	{ // Do the same for the ceiling.
		SetZ(ceilingz - Height);
	}
	// Do not interpolate from the position the actor was at when it was
	// picked up, in case that is different from where it is now.
	ClearInterpolation();
}